

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O1

lzma_ret lz_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                  size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  size_t *in_pos_00;
  size_t *psVar1;
  bool bVar2;
  lzma_ret lVar3;
  lzma_ret local_5c;
  
  if (*(long *)((long)coder_ptr + 0x70) == 0) {
    local_5c = decode_buffer((lzma_coder *)coder_ptr,in,in_pos,in_size,out,out_pos,out_size);
  }
  else {
    in_pos_00 = (size_t *)((long)coder_ptr + 0xa8);
    psVar1 = (size_t *)((long)coder_ptr + 0xb0);
    do {
      if (out_size <= *out_pos) {
        return LZMA_OK;
      }
      if ((*(char *)((long)coder_ptr + 0xa0) == '\0') && (*in_pos_00 == *psVar1)) {
        *in_pos_00 = 0;
        *(undefined8 *)((long)coder_ptr + 0xb0) = 0;
        lVar3 = (**(code **)((long)coder_ptr + 0x70))
                          (*(undefined8 *)((long)coder_ptr + 0x58),allocator,in,in_pos,in_size,
                           (uint8_t *)((long)coder_ptr + 0xb8),psVar1,0x1000,action);
        if (lVar3 == LZMA_OK) {
          if (*psVar1 == 0) goto LAB_006cca53;
LAB_006cca4f:
          bVar2 = true;
        }
        else {
          if (lVar3 == LZMA_STREAM_END) {
            *(undefined1 *)((long)coder_ptr + 0xa0) = 1;
            goto LAB_006cca4f;
          }
LAB_006cca53:
          bVar2 = false;
          local_5c = lVar3;
        }
        if (!bVar2) {
          return local_5c;
        }
      }
      if (*(char *)((long)coder_ptr + 0xa1) == '\x01') {
        if (*(long *)((long)coder_ptr + 0xb0) != 0) {
          return LZMA_DATA_ERROR;
        }
        return (uint)*(byte *)((long)coder_ptr + 0xa0);
      }
      lVar3 = decode_buffer((lzma_coder *)coder_ptr,(uint8_t *)((long)coder_ptr + 0xb8),in_pos_00,
                            *(size_t *)((long)coder_ptr + 0xb0),out,out_pos,out_size);
      if (lVar3 == LZMA_OK) {
        if ((*(char *)((long)coder_ptr + 0xa0) != '\x01') || (out_size <= *out_pos))
        goto LAB_006ccac5;
        local_5c = LZMA_DATA_ERROR;
        bVar2 = false;
      }
      else if (lVar3 == LZMA_STREAM_END) {
        *(undefined1 *)((long)coder_ptr + 0xa1) = 1;
LAB_006ccac5:
        bVar2 = true;
      }
      else {
        bVar2 = false;
        local_5c = lVar3;
      }
    } while (bVar2);
  }
  return local_5c;
}

Assistant:

static lzma_ret
lz_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_action action)
{
	lzma_coder *coder = coder_ptr;

	if (coder->next.code == NULL)
		return decode_buffer(coder, in, in_pos, in_size,
				out, out_pos, out_size);

	// We aren't the last coder in the chain, we need to decode
	// our input to a temporary buffer.
	while (*out_pos < out_size) {
		// Fill the temporary buffer if it is empty.
		if (!coder->next_finished
				&& coder->temp.pos == coder->temp.size) {
			coder->temp.pos = 0;
			coder->temp.size = 0;

			const lzma_ret ret = coder->next.code(
					coder->next.coder,
					allocator, in, in_pos, in_size,
					coder->temp.buffer, &coder->temp.size,
					LZMA_BUFFER_SIZE, action);

			if (ret == LZMA_STREAM_END)
				coder->next_finished = true;
			else if (ret != LZMA_OK || coder->temp.size == 0)
				return ret;
		}

		if (coder->this_finished) {
			if (coder->temp.size != 0)
				return LZMA_DATA_ERROR;

			if (coder->next_finished)
				return LZMA_STREAM_END;

			return LZMA_OK;
		}

		const lzma_ret ret = decode_buffer(coder, coder->temp.buffer,
				&coder->temp.pos, coder->temp.size,
				out, out_pos, out_size);

		if (ret == LZMA_STREAM_END)
			coder->this_finished = true;
		else if (ret != LZMA_OK)
			return ret;
		else if (coder->next_finished && *out_pos < out_size)
			return LZMA_DATA_ERROR;
	}

	return LZMA_OK;
}